

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O3

pair<sjtu::TrainManager::stationNameType_*,_long> __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::newspace
          (FileManager<sjtu::TrainManager::stationNameType> *this)

{
  undefined1 *puVar1;
  pair<sjtu::TrainManager::stationNameType_*,_long> pVar2;
  locType offset;
  stationNameType tmp;
  long local_50;
  undefined1 local_41 [41];
  
  puVar1 = &(this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).field_0x18;
  std::ostream::seekp((long)puVar1,_S_beg);
  std::ios::clear((int)this + 8 +
                  (int)*(undefined8 *)
                        (*(long *)&(this->
                                   super_FileManager_Base<sjtu::TrainManager::stationNameType>).file
                        + -0x18));
  local_50 = std::ostream::tellp();
  std::ostream::write(puVar1,(long)local_41);
  pVar2.first = LRUCache<sjtu::TrainManager::stationNameType>::load
                          ((this->super_FileManager_Base<sjtu::TrainManager::stationNameType>).cache
                           ,&local_50);
  pVar2.second = local_50;
  return pVar2;
}

Assistant:

virtual std::pair<T * , locType> newspace() override
		{
			file.seekp(0 , std::ios_base::end) , file.clear();
			T tmp;locType offset = file.tellp();
			file.write(reinterpret_cast<char *> (&tmp) , sizeof (T));
			return std::make_pair(cache -> load(offset) , offset);
		}